

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount)

{
  kj *this_00;
  uint in_ECX;
  size_t elementCount;
  size_t sVar1;
  ulong uVar2;
  undefined8 *puVar3;
  void **ptrCopy;
  kj *pkVar4;
  ArrayPtr<void_*const> AVar5;
  ArrayPtr<void_*> space;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  undefined8 *puVar6;
  kj local_178 [328];
  
  elementCount = (ulong)ignoreCount + 0x21;
  if (ignoreCount < 8) {
    puVar6 = (undefined8 *)0x0;
    this_00 = local_178;
    puVar3 = (undefined8 *)0x0;
    sVar1 = 0;
    pkVar4 = (kj *)0x0;
  }
  else {
    in_ECX = 0;
    this_00 = (kj *)_::HeapArrayDisposer::allocateImpl
                              (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
    puVar3 = &_::HeapArrayDisposer::instance;
    puVar6 = &_::HeapArrayDisposer::instance;
    sVar1 = elementCount;
    pkVar4 = this_00;
  }
  space.size_._0_4_ = ignoreCount + 1;
  space.ptr = (void **)elementCount;
  space.size_._4_4_ = 0;
  AVar5 = getStackTrace(this_00,space,in_ECX);
  space.size_ = AVar5.size_;
  if (ignoreCount + 2 < space.size_) {
    uVar2 = 0x20 - (ulong)this->traceCount;
    if (space.size_ <= uVar2) {
      uVar2 = space.size_;
    }
    memcpy(this->trace + this->traceCount,AVar5.ptr,uVar2 * 8);
    this->traceCount = this->traceCount + (int)uVar2;
  }
  if (pkVar4 != (kj *)0x0) {
    (**(code **)*puVar3)(puVar3,pkVar4,8,sVar1,sVar1,0,0,0,puVar6);
  }
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount) {
  KJ_STACK_ARRAY(void*, newTraceSpace, kj::size(trace) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.slice(0, kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
  }
}